

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

char * bc_strdup(char *s)

{
  size_t sVar1;
  char *tmp;
  size_t l;
  char *s_local;
  
  if (s == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(s);
    s_local = (char *)malloc(sVar1 + 1);
    if (s_local == (char *)0x0) {
      s_local = (char *)0x0;
    }
    else {
      memcpy(s_local,s,sVar1 + 1);
    }
  }
  return s_local;
}

Assistant:

char*
bc_strdup(const char *s)
{
    if (s == NULL)
        return NULL;
    size_t l = strlen(s);
    char *tmp = malloc(l + 1);
    if (tmp == NULL)
        return NULL;
    memcpy(tmp, s, l + 1);
    return tmp;
}